

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  uint uVar1;
  WavParser *this;
  TestFileType in_EDX;
  WavParser *MyParser;
  string Path;
  
  Path.field_2._12_4_ = 0;
  WavParserHelper::GetTestFilePath_abi_cxx11_((string *)&MyParser,(WavParserHelper *)0x4,in_EDX);
  this = (WavParser *)operator_new(0x34);
  WavParser::WavParser(this);
  uVar1 = (*this->_vptr_WavParser[2])(this,&MyParser);
  if ((uVar1 & 1) != 0) {
    (*this->_vptr_WavParser[3])();
  }
  std::istream::get();
  if (this != (WavParser *)0x0) {
    (*this->_vptr_WavParser[1])();
  }
  Path.field_2._12_4_ = 0;
  std::__cxx11::string::~string((string *)&MyParser);
  return Path.field_2._12_4_;
}

Assistant:

int main()
{
	std::string Path = WavParserHelper::GetTestFilePath(TestFileType::Int16Stereo);

	auto MyParser = new WavParser();

	if (MyParser->LoadFile(Path))
	{
		MyParser->Parse();
	}

	std::cin.get();

	delete MyParser;
	return 0;
}